

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_seq_coding_tools(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,int disable_frame_id_numbers)

{
  AV1_PRIMARY *ppi_00;
  int iVar1;
  int in_EDX;
  long in_RSI;
  AV1_PRIMARY *in_RDI;
  ToolCfg *tool_cfg;
  FrameDimensionCfg *frm_dim_cfg;
  SequenceHeader *seq;
  int local_4c;
  int local_48;
  int iVar2;
  int in_stack_ffffffffffffffc4;
  ushort uVar3;
  uint3 in_stack_ffffffffffffffcc;
  uint8_t uVar7;
  uint uVar4;
  undefined2 uVar6;
  uint uVar5;
  
  ppi_00 = (AV1_PRIMARY *)(in_RSI + 0x110);
  uVar5 = (uint)in_stack_ffffffffffffffcc;
  if ((*(byte *)(in_RSI + 0x121) & 1) == 0) {
    uVar5 = CONCAT13(*(int *)(in_RSI + 0xc) == 1,in_stack_ffffffffffffffcc);
  }
  uVar7 = (uint8_t)(uVar5 >> 0x18);
  (in_RDI->seq_params).still_picture = uVar7;
  uVar4 = CONCAT13(uVar7,(uint3)(ushort)uVar5);
  if ((in_RDI->seq_params).still_picture != '\0') {
    uVar4 = CONCAT13(uVar7,CONCAT12(*(undefined1 *)(in_RSI + 0x125),(ushort)uVar5)) ^ 0xff0000;
  }
  (in_RDI->seq_params).reduced_still_picture_hdr = (byte)(uVar4 >> 0x10) & 1;
  (in_RDI->seq_params).force_screen_content_tools = '\x02';
  (in_RDI->seq_params).force_integer_mv = '\x02';
  (in_RDI->seq_params).order_hint_info.enable_order_hint = (uint)(*(byte *)(in_RSI + 0x127) & 1);
  uVar6 = (undefined2)(uVar4 >> 0x10);
  uVar3 = (ushort)(byte)uVar4;
  uVar5 = CONCAT22(uVar6,uVar3);
  if ((((in_RDI->seq_params).reduced_still_picture_hdr == '\0') &&
      (uVar5 = CONCAT22(uVar6,uVar3), (*(byte *)(in_RSI + 0x360) & 1) == 0)) &&
     (uVar5 = CONCAT22(uVar6,uVar3), (*(byte *)(in_RSI + 0x122) & 1) != 0)) {
    uVar5 = CONCAT22(uVar6,CONCAT11(in_EDX != 0,(byte)uVar4)) ^ 0xff00;
  }
  (in_RDI->seq_params).frame_id_numbers_present_flag = (byte)(uVar5 >> 8) & 1;
  if ((in_RDI->seq_params).reduced_still_picture_hdr != '\0') {
    (in_RDI->seq_params).order_hint_info.enable_order_hint = 0;
    (in_RDI->seq_params).force_screen_content_tools = '\x02';
    (in_RDI->seq_params).force_integer_mv = '\x02';
  }
  iVar1 = -1;
  if ((in_RDI->seq_params).order_hint_info.enable_order_hint != 0) {
    iVar1 = 6;
  }
  (in_RDI->seq_params).order_hint_info.order_hint_bits_minus_1 = iVar1;
  if (*(int *)(in_RSI + 0x20) == 0) {
    if (*(int *)(in_RSI + 0x18) < (in_RDI->seq_params).max_frame_width) {
      in_stack_ffffffffffffffc4 = (in_RDI->seq_params).max_frame_width;
      iVar1 = in_stack_ffffffffffffffc4;
    }
    else {
      in_stack_ffffffffffffffc4 = *(int *)(in_RSI + 0x18);
      iVar1 = in_stack_ffffffffffffffc4;
    }
  }
  else {
    iVar1 = *(int *)(in_RSI + 0x20);
  }
  (in_RDI->seq_params).max_frame_width = iVar1;
  if (*(int *)(in_RSI + 0x24) == 0) {
    if (*(int *)(in_RSI + 0x1c) < (in_RDI->seq_params).max_frame_height) {
      iVar2 = (in_RDI->seq_params).max_frame_height;
    }
    else {
      iVar2 = *(int *)(in_RSI + 0x1c);
    }
  }
  else {
    iVar2 = *(int *)(in_RSI + 0x24);
  }
  (in_RDI->seq_params).max_frame_height = iVar2;
  if ((in_RDI->seq_params).max_frame_width < 2) {
    local_48 = 1;
  }
  else {
    local_48 = get_msb((in_RDI->seq_params).max_frame_width - 1);
    local_48 = local_48 + 1;
  }
  (in_RDI->seq_params).num_bits_width = local_48;
  if ((in_RDI->seq_params).max_frame_height < 2) {
    local_4c = 1;
  }
  else {
    local_4c = get_msb((in_RDI->seq_params).max_frame_height - 1);
    local_4c = local_4c + 1;
  }
  (in_RDI->seq_params).num_bits_height = local_4c;
  (in_RDI->seq_params).frame_id_length = 0xf;
  (in_RDI->seq_params).delta_frame_id_length = 0xe;
  (in_RDI->seq_params).enable_dual_filter = *(byte *)((long)ppi_00->parallel_cpi + 0x16) & 1;
  (in_RDI->seq_params).order_hint_info.enable_dist_wtd_comp = (uint)(*(byte *)(in_RSI + 0x3d8) & 1);
  (in_RDI->seq_params).order_hint_info.enable_dist_wtd_comp =
       (in_RDI->seq_params).order_hint_info.enable_order_hint &
       (in_RDI->seq_params).order_hint_info.enable_dist_wtd_comp;
  (in_RDI->seq_params).order_hint_info.enable_ref_frame_mvs =
       (uint)(*(byte *)(ppi_00->parallel_cpi + 3) & 1);
  (in_RDI->seq_params).order_hint_info.enable_ref_frame_mvs =
       (in_RDI->seq_params).order_hint_info.enable_order_hint &
       (in_RDI->seq_params).order_hint_info.enable_ref_frame_mvs;
  (in_RDI->seq_params).enable_superres = *(byte *)(in_RSI + 0xfc) & 1;
  (in_RDI->seq_params).enable_cdef = *(int *)((long)ppi_00->parallel_cpi + 0xc) != 0;
  (in_RDI->seq_params).enable_restoration = *(byte *)(ppi_00->parallel_cpi + 2) & 1;
  (in_RDI->seq_params).enable_warped_motion = *(byte *)(in_RSI + 0x3c4) & 1;
  (in_RDI->seq_params).enable_interintra_compound = *(byte *)((long)ppi_00->parallel_cpi + 0x1a) & 1
  ;
  (in_RDI->seq_params).enable_masked_compound = *(byte *)(in_RSI + 0x3d9) & 1;
  (in_RDI->seq_params).enable_intra_edge_filter = *(byte *)(in_RSI + 0x3c7) & 1;
  (in_RDI->seq_params).enable_filter_intra = *(byte *)(in_RSI + 0x3c8) & 1;
  set_bitstream_level_tier(ppi_00,uVar5,iVar1,(double)CONCAT44(in_stack_ffffffffffffffc4,iVar2));
  av1_set_svc_seq_params(in_RDI);
  return;
}

Assistant:

static void init_seq_coding_tools(AV1_PRIMARY *const ppi,
                                  const AV1EncoderConfig *oxcf,
                                  int disable_frame_id_numbers) {
  SequenceHeader *const seq = &ppi->seq_params;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  const ToolCfg *const tool_cfg = &oxcf->tool_cfg;

  seq->still_picture =
      !tool_cfg->force_video_mode && (oxcf->input_cfg.limit == 1);
  seq->reduced_still_picture_hdr =
      seq->still_picture && !tool_cfg->full_still_picture_hdr;
  seq->force_screen_content_tools = 2;
  seq->force_integer_mv = 2;
  seq->order_hint_info.enable_order_hint = tool_cfg->enable_order_hint;
  seq->frame_id_numbers_present_flag =
      !seq->reduced_still_picture_hdr &&
      !oxcf->tile_cfg.enable_large_scale_tile &&
      tool_cfg->error_resilient_mode && !disable_frame_id_numbers;
  if (seq->reduced_still_picture_hdr) {
    seq->order_hint_info.enable_order_hint = 0;
    seq->force_screen_content_tools = 2;
    seq->force_integer_mv = 2;
  }
  seq->order_hint_info.order_hint_bits_minus_1 =
      seq->order_hint_info.enable_order_hint
          ? DEFAULT_EXPLICIT_ORDER_HINT_BITS - 1
          : -1;

  seq->max_frame_width = frm_dim_cfg->forced_max_frame_width
                             ? frm_dim_cfg->forced_max_frame_width
                             : AOMMAX(seq->max_frame_width, frm_dim_cfg->width);
  seq->max_frame_height =
      frm_dim_cfg->forced_max_frame_height
          ? frm_dim_cfg->forced_max_frame_height
          : AOMMAX(seq->max_frame_height, frm_dim_cfg->height);
  seq->num_bits_width =
      (seq->max_frame_width > 1) ? get_msb(seq->max_frame_width - 1) + 1 : 1;
  seq->num_bits_height =
      (seq->max_frame_height > 1) ? get_msb(seq->max_frame_height - 1) + 1 : 1;
  assert(seq->num_bits_width <= 16);
  assert(seq->num_bits_height <= 16);

  seq->frame_id_length = FRAME_ID_LENGTH;
  seq->delta_frame_id_length = DELTA_FRAME_ID_LENGTH;

  seq->enable_dual_filter = tool_cfg->enable_dual_filter;
  seq->order_hint_info.enable_dist_wtd_comp =
      oxcf->comp_type_cfg.enable_dist_wtd_comp;
  seq->order_hint_info.enable_dist_wtd_comp &=
      seq->order_hint_info.enable_order_hint;
  seq->order_hint_info.enable_ref_frame_mvs = tool_cfg->ref_frame_mvs_present;
  seq->order_hint_info.enable_ref_frame_mvs &=
      seq->order_hint_info.enable_order_hint;
  seq->enable_superres = oxcf->superres_cfg.enable_superres;
  seq->enable_cdef = tool_cfg->cdef_control != CDEF_NONE ? 1 : 0;
  seq->enable_restoration = tool_cfg->enable_restoration;
  seq->enable_warped_motion = oxcf->motion_mode_cfg.enable_warped_motion;
  seq->enable_interintra_compound = tool_cfg->enable_interintra_comp;
  seq->enable_masked_compound = oxcf->comp_type_cfg.enable_masked_comp;
  seq->enable_intra_edge_filter = oxcf->intra_mode_cfg.enable_intra_edge_filter;
  seq->enable_filter_intra = oxcf->intra_mode_cfg.enable_filter_intra;

  set_bitstream_level_tier(ppi, frm_dim_cfg->width, frm_dim_cfg->height,
                           oxcf->input_cfg.init_framerate);
  av1_set_svc_seq_params(ppi);
}